

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_text.cc
# Opt level: O0

void __thiscall
lf::io::anon_unknown_0::
MshV4GrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::~MshV4GrammarText(MshV4GrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  MshV4GrammarText<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostElement,_std::allocator<lf::io::GMshFileV4::GhostElement>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->ghost_elements_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::GhostElement_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->ghost_element_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PeriodicLink,_std::allocator<lf::io::GMshFileV4::PeriodicLink>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->periodic_links_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PeriodicLink_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->periodic_link_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->matrix4d_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Elements_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->elements_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::ElementBlock_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->element_block_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Nodes_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->nodes_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::NodeBlock_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->node_block_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntities_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->partitioned_entities_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PartitionedPointEntity,_std::allocator<lf::io::GMshFileV4::PartitionedPointEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>,_std::vector<lf::io::GMshFileV4::PartitionedEntity,_std::allocator<lf::io::GMshFileV4::PartitionedEntity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->partitioned_entities2_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->partitioned_entity_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PartitionedPointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->partitioned_point_entity_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::GhostEntity,_std::allocator<lf::io::GMshFileV4::GhostEntity>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->ghost_entities_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::tuple<std::vector<lf::io::GMshFileV4::PointEntity,_std::allocator<lf::io::GMshFileV4::PointEntity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>,_std::vector<lf::io::GMshFileV4::Entity,_std::allocator<lf::io::GMshFileV4::Entity>_>_>_(),_boost::spirit::locals<unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->entities_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::Entity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->entity_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PointEntity_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->point_entity_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->entry_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<lf::io::GMshFileV4::PhysicalName,_std::allocator<lf::io::GMshFileV4::PhysicalName>_>_(),_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->physical_name_vector_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_lf::io::GMshFileV4::PhysicalName_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->physical_name_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<int,_std::allocator<int>_>,_boost::spirit::locals<unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type>
  ::~rule(&this->int_vec_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->vec3_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::locals<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->comment_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->start_comment_);
  boost::spirit::qi::
  rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~rule(&this->quoted_string_);
  boost::spirit::qi::
  grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::~grammar(&this->
              super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
            );
  return;
}

Assistant:

MshV4GrammarText() : MshV4GrammarText::base_type(entry_, "Msh File") {
    using phoenix::at_c;
    using phoenix::push_back;
    using phoenix::reserve;
    using phoenix::val;
    using qi::_val;
    using qi::attr;
    using qi::char_;
    using qi::double_;
    using qi::eps;
    using qi::int_;
    using qi::lexeme;
    using qi::lit;
    using qi::omit;
    using qi::repeat;
    using qi::labels::_1;
    using qi::labels::_2;
    using qi::labels::_3;
    using qi::labels::_4;
    using qi::labels::_a;
    using qi::labels::_b;
    using qi::labels::_c;
    using qi::labels::_d;

    auto size_t_ = qi::ulong_long;

    // General Parsers:
    quoted_string_ %= lexeme['"' >> +(char_ - '"') >> '"'];
    quoted_string_.name("string");
    vec3_ %= double_ > double_ > double_;  // NOLINT(misc-redundant-expression)
    int_vec_ %= omit[size_t_[(reserve(_val, _1), _a = _1)]] > repeat(_a)[int_];
    start_comment_ %= !lit("$PhysicalNames") >> !lit("$Entities") >>
                      !lit("$PartitionedEntities") >> !lit("$Nodes") >>
                      !lit("$Elements") >> !lit("$Periodic") >>
                      !lit("$GhostElements") >>
                      (lit('$') >> (+(char_ - qi::eol)));
    start_comment_.name("Start of Comment");
    comment_ %= start_comment_[_a = qi::_1] > *(char_ - '$') >> "$End" >>
                qi::string(_a);
    comment_.name("comment");
    qi::on_error<qi::fail>(comment_, error_handler_(_1, _2, _3, _4));

    // Physical names
    // NOLINTNEXTLINE(misc-redundant-expression)
    physical_name_ %= int_ > int_ > quoted_string_;
    physical_name_.name("Physical Name");
    qi::on_error<qi::fail>(physical_name_, error_handler_(_1, _2, _3, _4));
    physical_name_vector_ %= "$PhysicalNames" >
                             omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                             repeat(_a)[physical_name_] > "$EndPhysicalNames";
    physical_name_vector_.name("$PhyiscalNames");
    /*qi::on_error<qi::fail>(physical_name_vector_,
                           error_handler_(_1, _2, _3, _4));*/

    // entities:
    point_entity_ %= int_ > vec3_ > int_vec_;
    point_entity_.name("Point entity");

    entity_ %= int_ > vec3_ > vec3_ > int_vec_ > int_vec_;
    entity_.name("entity");

    entities_ %= "$Entities" >
                 omit[size_t_[(reserve(phoenix::at_c<0>(_val), _1), _a = _1)]] >
                 omit[size_t_[(reserve(phoenix::at_c<1>(_val), _1), _b = _1)]] >
                 omit[size_t_[(reserve(phoenix::at_c<2>(_val), _1), _c = _1)]] >
                 omit[size_t_[(reserve(phoenix::at_c<3>(_val), _1), _d = _1)]] >
                 repeat(_a)[point_entity_] > repeat(_b)[entity_] >
                 repeat(_c)[entity_] > repeat(_d)[entity_] > "$EndEntities";
    entities_.name("$Entities");
    qi::on_error<qi::fail>(entities_, error_handler_(_1, _2, _3, _4));

    // PartitionedEntities
    ghost_entities_ %=
        omit[size_t_[(reserve(_val, _1), _a = _1)]] >
        repeat(_a)[int_ > int_];  // NOLINT(misc-redundant-expression)
    ghost_entities_.name("ghost_entities");
    partitioned_point_entity_ %=
        int_ > int_ > int_ > int_vec_ > vec3_ > int_vec_;  // NOLINT
    partitioned_point_entity_.name("partitioned_point_entity");

    // NOLINTNEXTLINE
    partitioned_entity_ %= int_ > int_ > int_ > int_vec_ > vec3_ > vec3_ >
                           int_vec_ > int_vec_;  // NOLINT
    partitioned_entity_.name("partitioned_entity");

    partitioned_entities2_ %=
        omit[size_t_[(reserve(at_c<0>(_val), _1), _a = _1)]] >
        omit[size_t_[(reserve(at_c<1>(_val), _1), _b = _1)]] >
        omit[size_t_[(reserve(at_c<2>(_val), _1), _c = _1)]] >
        omit[size_t_[(reserve(at_c<3>(_val), _1), _d = _1)]] >
        repeat(_a)[partitioned_point_entity_] >
        repeat(_b)[partitioned_entity_] > repeat(_c)[partitioned_entity_] >
        repeat(_d)[partitioned_entity_];
    partitioned_entities2_.name("partitioned_entities2");

    partitioned_entities_ %= "$PartitionedEntities" > size_t_ >
                             ghost_entities_ > partitioned_entities2_ >
                             "$EndPartitionedEntities";
    partitioned_entities_.name("partitioned_entities");

    // nodes:
    node_block_ %=
        int_ > int_ > int_ >  // NOLINT
        omit[size_t_[(phoenix::resize(at_c<3>(_val), _1), _a = _1, _b = 0)]] >
        omit[repeat(_a)[size_t_[at_c<0>(at_c<3>(_val)[_b++]) = _1]]] >
        eps[_b = 0] >
        omit[repeat(_a)[vec3_[at_c<1>(at_c<3>(_val)[_b++]) = _1]]];
    node_block_.name("node_block");

    nodes_ %= "$Nodes" > omit[size_t_[(reserve(at_c<3>(_val), _1), _a = _1)]] >
              size_t_ > size_t_ > size_t_ > repeat(_a)[node_block_] >
              "$EndNodes";
    nodes_.name("nodes");

    // elements:
    element_block_ %=
        int_ > int_ > int_ >  // NOLINT
        omit[size_t_[(reserve(at_c<3>(_val), _1), _a = _1)]] >
        repeat(_a)[size_t_ > repeat(numNodesAdapted(at_c<2>(_val)))[size_t_]];
    element_block_.name("element_block");

    elements_ %= "$Elements" >
                 omit[size_t_[(reserve(at_c<3>(_val), _1), _a = _1)]] >
                 size_t_ > size_t_ > size_t_ > repeat(_a)[element_block_] >
                 "$EndElements";
    elements_.name("elements");

    // periodic link
    // NOLINTNEXTLINE
    matrix4d_ %= double_ > double_ > double_ > double_ > double_ > double_ >
                 double_ > double_ > double_ > double_ > double_ > double_ >
                 double_ > double_ > double_ > double_;
    matrix4d_.name("matrix4d");

    // NOLINTNEXTLINE
    periodic_link_ %= int_ > int_ > int_ > ('0' | ("16" > matrix4d_)) >
                      omit[size_t_[(reserve(at_c<4>(_val), _1), _a = _1)]] >
                      repeat(_a)[size_t_ > size_t_];
    periodic_link_.name("periodic_link");

    periodic_links_ %= "$Periodic" >
                       omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[periodic_link_] > "$EndPeriodic";
    periodic_links_.name("periodic_links");

    // ghost elements:
    ghost_element_ %= size_t_ > int_ >
                      omit[size_t_[(reserve(at_c<2>(_val), _1), _a = _1)]] >
                      repeat(_a)[int_];
    ghost_element_.name("ghost_element");

    ghost_elements_ %= "$GhostElements" >
                       omit[size_t_[(reserve(_val, _1), _a = _1)]] >
                       repeat(_a)[ghost_element_] > "$EndGhostElements";
    ghost_elements_.name("ghost_elements");

    // The whole file
    entry_ %= *comment_ >> -(physical_name_vector_ >> *comment_) >> entities_ >>
              *comment_ >> -(partitioned_entities_ >> *comment_) >> nodes_ >>
              *comment_ >> elements_ >> *comment_ >>
              -(periodic_links_ >> *comment_) >>
              -(ghost_elements_ >> *comment_);
    entry_.name("entry");

    qi::on_error<qi::fail>(entry_, error_handler_(_1, _2, _3, _4));
  }